

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

void Diligent::AppendShaderSourceLanguageDefinition(string *Source,SHADER_SOURCE_LANGUAGE Language)

{
  string sStack_38;
  
  std::__cxx11::string::append((char *)Source);
  std::__cxx11::string::append((string *)Source);
  std::__cxx11::string::push_back((char)Source);
  std::__cxx11::to_string(&sStack_38,Language);
  std::__cxx11::string::append((string *)Source);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::append((char *)Source);
  return;
}

Assistant:

void AppendShaderSourceLanguageDefinition(std::string& Source, SHADER_SOURCE_LANGUAGE Language)
{
    Source += "/*";
    Source += ShaderSourceLanguageKey;
    Source += '=';
    Source += std::to_string(static_cast<Uint32>(Language));
    Source += "*/";
}